

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall wallet::LegacyScriptPubKeyMan::TopUp(LegacyScriptPubKeyMan *this,uint kpSize)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  __node_base *p_Var4;
  long in_FS_OFFSET;
  WalletBatch batch;
  WalletBatch local_80;
  char local_70 [32];
  string local_50;
  long local_30;
  WalletDatabase *pWVar3;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CanGenerateKeys(this);
  if (bVar1) {
    iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3]
            )();
    pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
    (*pWVar3->_vptr_WalletDatabase[0xe])(&local_80,pWVar3,1);
    local_80.m_database = pWVar3;
    bVar1 = WalletBatch::TxnBegin(&local_80);
    if (bVar1) {
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)kpSize;
      bVar1 = TopUpChain(this,&local_80,&(this->super_LegacyDataSPKM).m_hd_chain,kpSize);
      if (bVar1) {
        p_Var4 = &(this->super_LegacyDataSPKM).m_inactive_hd_chains._M_h._M_before_begin;
        do {
          p_Var4 = p_Var4->_M_nxt;
          if (p_Var4 == (__node_base *)0x0) {
            bVar1 = WalletBatch::TxnCommit(&local_80);
            if (bVar1) {
              bVar1 = true;
              boost::signals2::
              signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
              ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                            NotifyCanGetAddressesChanged);
              goto LAB_004f3277;
            }
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[2]
            )(local_70);
            tinyformat::format<std::__cxx11::string>
                      (&local_50,
                       (tinyformat *)
                       "Error during keypool top up. Cannot commit changes for wallet %s",local_70,
                       args);
            std::runtime_error::runtime_error(this_00,(string *)&local_50);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_004f33d3;
          }
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)kpSize;
          bVar1 = TopUpChain(this,&local_80,(CHDChain *)(p_Var4 + 4),kpSize);
        } while (bVar1);
      }
    }
    bVar1 = false;
LAB_004f3277:
    if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
        local_80.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_80.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
LAB_004f33d3:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::TopUp(unsigned int kpSize)
{
    if (!CanGenerateKeys()) {
        return false;
    }

    WalletBatch batch(m_storage.GetDatabase());
    if (!batch.TxnBegin()) return false;
    if (!TopUpChain(batch, m_hd_chain, kpSize)) {
        return false;
    }
    for (auto& [chain_id, chain] : m_inactive_hd_chains) {
        if (!TopUpChain(batch, chain, kpSize)) {
            return false;
        }
    }
    if (!batch.TxnCommit()) throw std::runtime_error(strprintf("Error during keypool top up. Cannot commit changes for wallet %s", m_storage.GetDisplayName()));
    NotifyCanGetAddressesChanged();
    // Note: Unlike with DescriptorSPKM, LegacySPKM does not need to call
    // m_storage.TopUpCallback() as we do not know what new scripts the LegacySPKM is
    // watching for. CWallet's scriptPubKey cache is not used for LegacySPKMs.
    return true;
}